

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailure.cpp
# Opt level: O1

void __thiscall
MockFailure::addExpectationsAndCallHistory(MockFailure *this,MockExpectedCallsList *expectations)

{
  SimpleString *this_00;
  SimpleString SStack_38;
  SimpleString local_28;
  
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator+=(this_00,"\tEXPECTED calls that WERE NOT fulfilled:\n");
  SimpleString::SimpleString(&local_28,"\t\t");
  (*expectations->_vptr_MockExpectedCallsList[0x1f])(&SStack_38,expectations,&local_28);
  SimpleString::operator+=(this_00,&SStack_38);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::operator+=(this_00,"\n\tEXPECTED calls that WERE fulfilled:\n");
  SimpleString::SimpleString(&local_28,"\t\t");
  (*expectations->_vptr_MockExpectedCallsList[0x20])(&SStack_38,expectations,&local_28);
  SimpleString::operator+=(this_00,&SStack_38);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

void MockFailure::addExpectationsAndCallHistory(const MockExpectedCallsList& expectations)
{
    message_ += "\tEXPECTED calls that WERE NOT fulfilled:\n";
    message_ += expectations.unfulfilledCallsToString("\t\t");
    message_ += "\n\tEXPECTED calls that WERE fulfilled:\n";
    message_ += expectations.fulfilledCallsToString("\t\t");
}